

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O0

void __thiscall
Eigen::internal::
BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>,_-1,_1,_false,_true>
::BlockImpl_dense(BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,__1,_1,_false,_true>
                  *this,Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false> *xpr,
                 Index startRow,Index startCol,Index blockRows,Index blockCols)

{
  ScalarWithConstIfNotLvalue *ptr;
  MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,__1,_1,_false>,_1>
  *in_RCX;
  EVP_PKEY_CTX *in_RSI;
  BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,__1,_1,_false,_true>
  *in_RDI;
  PointerType in_R8;
  Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false> *in_R9;
  MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_1> *unaff_retaddr;
  
  ptr = MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>,_1>::coeffRef
                  (unaff_retaddr,(Index)in_RDI,(Index)in_RSI);
  const_cast_ptr<double>(ptr);
  MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>,_-1,_1,_false>,_1>
  ::MapBase(in_RCX,in_R8,(Index)in_R9,(Index)in_RDI);
  Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>::Block
            (in_R9,(Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false> *)in_RDI);
  init(in_RDI,in_RSI);
  return;
}

Assistant:

inline BlockImpl_dense(XprType& xpr,
          Index startRow, Index startCol,
          Index blockRows, Index blockCols)
      : Base(internal::const_cast_ptr(&xpr.coeffRef(startRow,startCol)), blockRows, blockCols),
        m_xpr(xpr)
    {
      init();
    }